

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreadtetgen.cpp
# Opt level: O0

TPZGeoMesh * __thiscall
TPZReadTetGen::Process
          (TPZReadTetGen *this,string *NodeFileName,string *FaceFileName,string *TetraFileName)

{
  TPZGeoMesh *pTVar1;
  string *psVar2;
  ostream *this_00;
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  TPZMultiTimer time;
  bool check;
  int64_t nvols;
  int64_t nfaces;
  int64_t nnodes;
  TPZGeoMesh *gmesh;
  int64_t *in_stack_000001a8;
  TPZGeoMesh *in_stack_000001b0;
  string *in_stack_000001b8;
  TPZGeoMesh *in_stack_000001c0;
  int64_t *in_stack_000001f0;
  TPZGeoMesh *in_stack_000001f8;
  TPZGeoMesh *in_stack_00000200;
  string *in_stack_00000208;
  TPZReadTetGen *in_stack_00000210;
  undefined8 in_stack_fffffffffffffe98;
  int i;
  TPZMultiTimer *in_stack_fffffffffffffea0;
  TPZGeoMesh *in_stack_fffffffffffffed0;
  TPZMultiTimer *in_stack_fffffffffffffef0;
  string local_e0 [24];
  TPZMultiTimer *in_stack_ffffffffffffff38;
  ostream *in_stack_ffffffffffffff40;
  string local_98 [32];
  undefined1 local_78 [31];
  byte local_59;
  TPZGeoMesh *local_30;
  TPZGeoMesh *local_8;
  
  i = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  pTVar1 = (TPZGeoMesh *)operator_new(0x2a8);
  TPZGeoMesh::TPZGeoMesh(in_stack_fffffffffffffed0);
  local_30 = pTVar1;
  TPZMultiTimer::TPZMultiTimer(in_stack_fffffffffffffef0,(int)((ulong)local_78 >> 0x20));
  psVar2 = TPZMultiTimer::processName_abi_cxx11_(in_stack_fffffffffffffea0,i);
  std::__cxx11::string::operator=((string *)psVar2,"Reading nodes");
  psVar2 = TPZMultiTimer::processName_abi_cxx11_(in_stack_fffffffffffffea0,i);
  std::__cxx11::string::operator=((string *)psVar2,"Reading faces");
  psVar2 = TPZMultiTimer::processName_abi_cxx11_(in_stack_fffffffffffffea0,i);
  std::__cxx11::string::operator=((string *)psVar2,"Reading tetrahedras");
  psVar2 = TPZMultiTimer::processName_abi_cxx11_(in_stack_fffffffffffffea0,i);
  std::__cxx11::string::operator=((string *)psVar2,"BuildConnectivity");
  TPZMultiTimer::start(in_stack_fffffffffffffea0,i);
  std::__cxx11::string::string(local_98,in_RSI);
  local_59 = ProcessNodes((TPZReadTetGen *)in_stack_00000208,(string *)in_stack_00000200,
                          in_stack_000001f8,in_stack_000001f0);
  std::__cxx11::string::~string(local_98);
  TPZMultiTimer::stop(in_stack_fffffffffffffea0,i);
  if ((local_59 & 1) == 0) {
    if (local_30 != (TPZGeoMesh *)0x0) {
      (*(local_30->super_TPZSavable)._vptr_TPZSavable[1])();
    }
    local_8 = (TPZGeoMesh *)0x0;
  }
  else {
    TPZMultiTimer::start(in_stack_fffffffffffffea0,i);
    std::__cxx11::string::string((string *)&stack0xffffffffffffff40,in_RDX);
    local_59 = ProcessFaces((TPZReadTetGen *)in_stack_000001c0,in_stack_000001b8,in_stack_000001b0,
                            in_stack_000001a8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
    TPZMultiTimer::stop(in_stack_fffffffffffffea0,i);
    if ((local_59 & 1) == 0) {
      if (local_30 != (TPZGeoMesh *)0x0) {
        (*(local_30->super_TPZSavable)._vptr_TPZSavable[1])();
      }
      local_8 = (TPZGeoMesh *)0x0;
    }
    else {
      TPZMultiTimer::start(in_stack_fffffffffffffea0,i);
      std::__cxx11::string::string(local_e0,in_RCX);
      local_59 = ProcessTetra(in_stack_00000210,in_stack_00000208,in_stack_00000200,
                              (int64_t *)in_stack_000001f8);
      std::__cxx11::string::~string(local_e0);
      TPZMultiTimer::stop(in_stack_fffffffffffffea0,i);
      if ((local_59 & 1) == 0) {
        if (local_30 != (TPZGeoMesh *)0x0) {
          (*(local_30->super_TPZSavable)._vptr_TPZSavable[1])();
        }
        local_8 = (TPZGeoMesh *)0x0;
      }
      else {
        TPZMultiTimer::start(in_stack_fffffffffffffea0,i);
        TPZGeoMesh::BuildConnectivity(in_stack_000001c0);
        TPZMultiTimer::stop(in_stack_fffffffffffffea0,i);
        this_00 = ::operator<<(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        local_8 = local_30;
      }
    }
  }
  TPZMultiTimer::~TPZMultiTimer((TPZMultiTimer *)0x1f4ba2d);
  return local_8;
}

Assistant:

TPZGeoMesh * TPZReadTetGen::Process(std::string NodeFileName, std::string FaceFileName, std::string TetraFileName) {
	TPZGeoMesh * gmesh = new TPZGeoMesh();
	int64_t nnodes;
	int64_t nfaces, nvols;
	bool check;
	
	TPZMultiTimer time(4);
	time.processName(0) = "Reading nodes";
	time.processName(1) = "Reading faces";
	time.processName(2) = "Reading tetrahedras";
	time.processName(3) = "BuildConnectivity";
	
	time.start(0);
	check = this->ProcessNodes(NodeFileName, *gmesh, nnodes);
	time.stop(0);
	if (check == false){
		delete gmesh;
		return NULL;
	}
	
	time.start(1);
	check = this->ProcessFaces(FaceFileName, *gmesh, nfaces);
	time.stop(1);
	if (check == false){
		delete gmesh;
		return NULL;
	}
	
	time.start(2);
	check = this->ProcessTetra(TetraFileName, *gmesh, nvols);
	time.stop(2);
	if (check == false){
		delete gmesh;
		return NULL;
	}
    
	time.start(3);
	gmesh->BuildConnectivity();
	time.stop(3);
	
	std::cout << time << std::endl;
	
	return gmesh;
	
}